

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O0

SockData * AGSSock::SockData_CreateEmpty(void)

{
  SockData *this;
  SockData *data;
  
  this = (SockData *)operator_new(0x20);
  SockData::SockData(this);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
  return this;
}

Assistant:

SockData *SockData_CreateEmpty()
{
	SockData *data = new SockData();
	AGS_OBJECT(SockData, data);
	return data;
}